

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::
MapSet<BVSparse<Memory::JitArenaAllocator>*,false>
          (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *this,uint baseSetMember,
          _func_void_uint_BVSparse<Memory::JitArenaAllocator>_ptr *callBack,
          BVSparse<Memory::JitArenaAllocator> *accessory)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint local_30;
  uint i;
  uint baseSet;
  BVSparse<Memory::JitArenaAllocator> *accessory_local;
  _func_void_uint_BVSparse<Memory::JitArenaAllocator>_ptr *callBack_local;
  uint baseSetMember_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  if (((byte)this[0x10] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
                       ,0x171,"(consolidated)","consolidated");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = Lookup<false,true>(this,baseSetMember);
  (*callBack)(uVar3,accessory);
  local_30 = uVar3;
  while (local_30 = local_30 + 1, local_30 < *(uint *)this) {
    if (*(long *)(*(long *)(this + 8) + (ulong)(local_30 >> 4) * 8) == 0) {
      local_30 = (0xf - (local_30 & 0xf)) + local_30;
    }
    else if (*(uint *)(*(long *)(*(long *)(this + 8) + (ulong)(local_30 >> 4) * 8) +
                      (ulong)(local_30 & 0xf) * 4) == uVar3) {
      (*callBack)(local_30,accessory);
    }
  }
  return;
}

Assistant:

inline void MapSet(indexType baseSetMember, void(*callBack)(indexType, MapAccessoryType), MapAccessoryType accessory)
    {
        Assert(consolidated);
        indexType baseSet = Lookup<false, true>(baseSetMember);
        if (!onlyNonIdentity)
        {
            callBack(baseSet, accessory);
        }
        // We now only need to look at the stuff greater than baseSet
        for (indexType i = baseSet + 1; i < maxIndex; i++)
        {
            if (backingStore[i / numPerSegment] == nullptr)
            {
                // advance to the next block if this one is an identity block
                i += (numPerSegment - (i % numPerSegment)) - 1;
                continue;
            }
            if (backingStore[i / numPerSegment][i % numPerSegment] == baseSet)
            {
                callBack(i, accessory);
            }
        }
    }